

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O0

void __thiscall
OpenMesh::BaseKernel::add_property<OpenMesh::VectorT<double,3>>
          (BaseKernel *this,FPropHandleT<OpenMesh::VectorT<double,_3>_> *_ph,string *_name)

{
  int iVar1;
  undefined4 extraout_var;
  VectorT<double,_3> local_40;
  BaseHandle local_28;
  FPropHandleT<OpenMesh::VectorT<double,_3>_> local_24;
  string *local_20;
  string *_name_local;
  FPropHandleT<OpenMesh::VectorT<double,_3>_> *_ph_local;
  BaseKernel *this_local;
  
  local_20 = _name;
  _name_local = (string *)_ph;
  _ph_local = (FPropHandleT<OpenMesh::VectorT<double,_3>_> *)this;
  VectorT<double,_3>::VectorT(&local_40);
  local_28.idx_ =
       (int)PropertyContainer::add<OpenMesh::VectorT<double,3>>(&this->fprops_,&local_40,local_20);
  FPropHandleT<OpenMesh::VectorT<double,_3>_>::FPropHandleT
            (&local_24,(BasePropHandleT<OpenMesh::VectorT<double,_3>_> *)&local_28);
  *(BasePropHandleT<OpenMesh::VectorT<double,_3>_> *)_name_local =
       local_24.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.super_BaseHandle.idx_;
  iVar1 = (*this->_vptr_BaseKernel[5])();
  PropertyContainer::resize(&this->fprops_,CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void add_property( FPropHandleT<T>& _ph, const std::string& _name="<fprop>")
  {
    _ph = FPropHandleT<T>( fprops_.add(T(), _name) );
    fprops_.resize(n_faces());
  }